

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_create_resolving_functions(JSContext *ctx,JSValue *resolving_funcs,JSValue promise)

{
  int iVar1;
  JSRuntime *pJVar2;
  int *piVar3;
  JSValueUnion JVar4;
  JSValueUnion *pJVar5;
  JSValueUnion JVar6;
  int iVar7;
  JSClassID class_id;
  long lVar8;
  JSValue JVar9;
  uint local_38;
  
  JVar6 = promise.u;
  piVar3 = (int *)js_malloc(ctx,8);
  if (piVar3 == (int *)0x0) {
    iVar7 = -1;
  }
  else {
    piVar3[0] = 1;
    piVar3[1] = 0;
    class_id = 0x2b;
    lVar8 = 0;
    do {
      JVar9 = JS_NewObjectProtoClass(ctx,ctx->function_proto,class_id);
      JVar4 = JVar9.u;
      if ((JVar9.tag & 0xffffffffU) == 6) {
LAB_001496e4:
        iVar7 = -1;
        if (lVar8 != 0) {
          JVar9 = *resolving_funcs;
          if ((0xfffffff4 < (uint)resolving_funcs->tag) &&
             (iVar1 = *(resolving_funcs->u).ptr, *(int *)(resolving_funcs->u).ptr = iVar1 + -1,
             iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
        }
        goto LAB_00149722;
      }
      pJVar5 = (JSValueUnion *)js_malloc(ctx,0x18);
      if (pJVar5 == (JSValueUnion *)0x0) {
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar7 = *JVar4.ptr, *(int *)JVar4.ptr = iVar7 + -1, iVar7 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
        goto LAB_001496e4;
      }
      *piVar3 = *piVar3 + 1;
      pJVar5[2].ptr = piVar3;
      local_38 = (uint)promise.tag;
      if (0xfffffff4 < local_38) {
        *(int *)JVar6.ptr = *JVar6.ptr + 1;
      }
      pJVar5->ptr = (void *)JVar6;
      pJVar5[1] = (JSValueUnion)promise.tag;
      if ((uint)JVar9.tag == 0xffffffff) {
        *(JSValueUnion **)((long)JVar4.ptr + 0x30) = pJVar5;
      }
      js_function_set_properties(ctx,JVar9,0x2f,1);
      ((JSValueUnion *)((long)&resolving_funcs->u + lVar8))->ptr = (void *)JVar4;
      *(int64_t *)((long)&resolving_funcs->tag + lVar8) = JVar9.tag;
      lVar8 = lVar8 + 0x10;
      class_id = class_id + 1;
    } while (lVar8 == 0x10);
    iVar7 = 0;
LAB_00149722:
    pJVar2 = ctx->rt;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,piVar3);
    }
  }
  return iVar7;
}

Assistant:

static int js_create_resolving_functions(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst promise)

{
    JSValue obj;
    JSPromiseFunctionData *s;
    JSPromiseFunctionDataResolved *sr;
    int i, ret;

    sr = js_malloc(ctx, sizeof(*sr));
    if (!sr)
        return -1;
    sr->ref_count = 1;
    sr->already_resolved = FALSE; /* must be shared between the two functions */
    ret = 0;
    for(i = 0; i < 2; i++) {
        obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                     JS_CLASS_PROMISE_RESOLVE_FUNCTION + i);
        if (JS_IsException(obj))
            goto fail;
        s = js_malloc(ctx, sizeof(*s));
        if (!s) {
            JS_FreeValue(ctx, obj);
        fail:

            if (i != 0)
                JS_FreeValue(ctx, resolving_funcs[0]);
            ret = -1;
            break;
        }
        sr->ref_count++;
        s->presolved = sr;
        s->promise = JS_DupValue(ctx, promise);
        JS_SetOpaque(obj, s);
        js_function_set_properties(ctx, obj, JS_ATOM_empty_string, 1);
        resolving_funcs[i] = obj;
    }
    js_promise_resolve_function_free_resolved(ctx->rt, sr);
    return ret;
}